

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

ostringstream * __thiscall clask::logger::get_abi_cxx11_(logger *this,log_level level)

{
  tm *ptVar1;
  _Put_time<char> __f;
  undefined1 auStack_58 [8];
  tm tm;
  time_t t;
  log_level level_local;
  logger *this_local;
  
  tm.tm_zone = (char *)time((time_t *)0x0);
  ptVar1 = localtime((time_t *)&tm.tm_zone);
  tm.tm_gmtoff = (long)ptVar1->tm_zone;
  auStack_58._0_4_ = ptVar1->tm_sec;
  auStack_58._4_4_ = ptVar1->tm_min;
  tm.tm_sec = ptVar1->tm_hour;
  tm.tm_min = ptVar1->tm_mday;
  tm.tm_hour = ptVar1->tm_mon;
  tm.tm_mday = ptVar1->tm_year;
  tm.tm_mon = ptVar1->tm_wday;
  tm.tm_year = ptVar1->tm_yday;
  tm.tm_wday = ptVar1->tm_isdst;
  tm.tm_yday = *(int *)&ptVar1->field_0x24;
  tm._32_8_ = ptVar1->tm_gmtoff;
  __f = std::put_time<char>((tm *)auStack_58,"%Y/%m/%d %H:%M:%S ");
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&this->os,__f);
  switch(level) {
  case ERR:
    std::operator<<((ostream *)&this->os,"ERR: ");
    break;
  case WARN:
    std::operator<<((ostream *)&this->os,"WARN: ");
    break;
  case INFO:
    std::operator<<((ostream *)&this->os,"INFO: ");
    break;
  case DEBUG:
    std::operator<<((ostream *)&this->os,"DEBUG: ");
  }
  this->lv = level;
  return &this->os;
}

Assistant:

inline std::ostringstream& logger::get(log_level level) {
  auto t = std::time(nullptr);
  auto tm = *std::localtime(&t);
  os << std::put_time(&tm, "%Y/%m/%d %H:%M:%S ");
  switch (level) {
    case log_level::ERR: os << "ERR: "; break;
    case log_level::WARN: os << "WARN: "; break;
    case log_level::INFO: os << "INFO: "; break;
    case log_level::DEBUG: os << "DEBUG: "; break;
    default: break;
  }
  lv = level;
  return os;
}